

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O2

void __thiscall
nnad::Matrix<double>::Matrix
          (Matrix<double> *this,Matrix<double> *x,function<double_(const_double_&)> *f)

{
  int iVar1;
  int iVar2;
  int i;
  long lVar3;
  long lVar4;
  double dVar5;
  vector<double,_std::allocator<double>_> xv;
  _Vector_base<double,_std::allocator<double>_> local_38;
  
  iVar1 = x->_Lines;
  this->_Lines = iVar1;
  iVar2 = x->_Columns;
  this->_Columns = iVar2;
  std::vector<double,_std::allocator<double>_>::vector
            (&this->_Matrix,(long)(iVar2 * iVar1),(allocator_type *)&local_38);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_38,&x->_Matrix);
  lVar4 = 0;
  for (lVar3 = 0;
      lVar3 < (int)((ulong)((long)local_38._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_38._M_impl.super__Vector_impl_data._M_start) >> 3);
      lVar3 = lVar3 + 1) {
    dVar5 = std::function<double_(const_double_&)>::operator()
                      (f,(double *)((long)local_38._M_impl.super__Vector_impl_data._M_start + lVar4)
                      );
    *(double *)
     ((long)(this->_Matrix).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + lVar4) = dVar5;
    lVar4 = lVar4 + 8;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

Matrix(Matrix const& x, std::function<T(T const&)> f):
      _Lines(x.GetLines()),
      _Columns(x.GetColumns()),
      _Matrix(_Lines * _Columns)
    {
      const std::vector<T> xv = x.GetVector();
      for (int i = 0; i < (int) xv.size(); i++)
        _Matrix[i] = f(xv[i]);
    }